

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall
CServerBrowser::Set(CServerBrowser *this,NETADDR *Addr,int SetType,int Token,CServerInfo *pInfo)

{
  long lVar1;
  CServerEntry *pCVar2;
  int iVar3;
  CServerEntry *pCVar4;
  CServerEntry *pCVar5;
  long lVar6;
  int64 iVar7;
  int64 iVar8;
  int iVar9;
  CServerEntry **ppCVar10;
  int64 *piVar11;
  
  if (SetType == 3) {
    if (((((this->m_RefreshFlags & 1) == 0) ||
         (pCVar4 = Find(this,0,Addr), pCVar4 == (CServerEntry *)0x0)) || (pCVar4->m_InfoState != 1))
       || (pCVar4->m_CurrentToken != Token)) {
      if ((this->m_RefreshFlags & 2) == 0) {
        return;
      }
      lVar6 = this->m_BroadcastTime;
      iVar8 = time_freq();
      iVar7 = time_get();
      if (iVar8 + lVar6 < iVar7) {
        return;
      }
      pCVar4 = Add(this,1,Addr);
      if (pCVar4 == (CServerEntry *)0x0) {
        return;
      }
      piVar11 = &this->m_BroadcastTime;
      SetInfo(this,1,pCVar4,pInfo);
      lVar6 = time_get();
    }
    else {
      SetInfo(this,0,pCVar4,pInfo);
      lVar6 = time_get();
      piVar11 = &pCVar4->m_RequestTime;
    }
    lVar1 = *piVar11;
    iVar8 = time_freq();
    iVar3 = (int)(((lVar6 - lVar1) * 1000) / iVar8);
    iVar9 = 999;
    if (iVar3 < 999) {
      iVar9 = iVar3;
    }
    (pCVar4->m_Info).m_Latency = iVar9;
    this->m_InfoUpdated = true;
    pCVar5 = pCVar4->m_pPrevReq;
    pCVar2 = pCVar4->m_pNextReq;
    if (pCVar5 == (CServerEntry *)0x0) {
      ppCVar10 = &this->m_pFirstReqServer;
      if ((pCVar2 == (CServerEntry *)0x0) && (this->m_pFirstReqServer != pCVar4)) goto LAB_0012a7d3;
    }
    else {
      ppCVar10 = &pCVar5->m_pNextReq;
    }
    *ppCVar10 = pCVar2;
    ppCVar10 = &pCVar2->m_pPrevReq;
    if (pCVar2 == (CServerEntry *)0x0) {
      ppCVar10 = &this->m_pLastReqServer;
    }
    *ppCVar10 = pCVar5;
    pCVar4->m_pPrevReq = (CServerEntry *)0x0;
    pCVar4->m_pNextReq = (CServerEntry *)0x0;
    iVar9 = -1;
  }
  else {
    if (SetType == 2) {
      if ((this->m_RefreshFlags & 1) == 0) {
        return;
      }
    }
    else {
      if (SetType != 1) {
        return;
      }
      if ((this->m_RefreshFlags & 1) == 0) {
        return;
      }
      this->m_MasterRefreshTime = 0;
    }
    pCVar4 = Find(this,0,Addr);
    if (pCVar4 != (CServerEntry *)0x0) {
      return;
    }
    pCVar5 = Add(this,0,Addr);
    pCVar4 = this->m_pLastReqServer;
    ppCVar10 = &pCVar4->m_pNextReq;
    if (pCVar4 == (CServerEntry *)0x0) {
      ppCVar10 = &this->m_pFirstReqServer;
    }
    pCVar5->m_pPrevReq = pCVar4;
    *ppCVar10 = pCVar5;
    this->m_pLastReqServer = pCVar5;
    iVar9 = 1;
  }
  this->m_NumRequests = this->m_NumRequests + iVar9;
LAB_0012a7d3:
  CServerBrowserFilter::Sort
            (&this->m_ServerBrowserFilter,
             this->m_aServerlist[this->m_ActServerlistType].m_ppServerlist,
             this->m_aServerlist[this->m_ActServerlistType].m_NumServers,1);
  return;
}

Assistant:

void CServerBrowser::Set(const NETADDR &Addr, int SetType, int Token, const CServerInfo *pInfo)
{
	CServerEntry *pEntry = 0;
	switch(SetType)
	{
	case SET_MASTER_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			m_MasterRefreshTime = 0;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_FAV_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_TOKEN:
		{
			int Type;

			// internet entry
			if(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
			{
				Type = IServerBrowser::TYPE_INTERNET;
				pEntry = Find(Type, Addr);
				if(pEntry && (pEntry->m_InfoState != CServerEntry::STATE_PENDING || Token != pEntry->m_CurrentToken))
					pEntry = 0;
			}

			// lan entry
			if(!pEntry && (m_RefreshFlags&IServerBrowser::REFRESHFLAG_LAN) && m_BroadcastTime+time_freq() >= time_get())
			{
				Type = IServerBrowser::TYPE_LAN;
				pEntry = Add(Type, Addr);
			}

			// set info
			if(pEntry)
			{
				SetInfo(Type, pEntry, *pInfo);
				if(Type == IServerBrowser::TYPE_LAN)
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-m_BroadcastTime)*1000/time_freq()), 999);
				else
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-pEntry->m_RequestTime)*1000/time_freq()), 999);
				m_InfoUpdated = true;
				RemoveRequest(pEntry);
			}
		}
	}

	if(pEntry)
		m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FORCE);
}